

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForkNode.cpp
# Opt level: O3

void __thiscall ForkNode::ForkNode(ForkNode *this,Instruction *instruction,CallInst *callInst)

{
  _Rb_tree_header *p_Var1;
  
  Node::Node(&this->super_Node,FORK,instruction,callInst);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__ForkNode_00125ad0;
  p_Var1 = &(this->forkSuccessors_)._M_t._M_impl.super__Rb_tree_header;
  (this->forkSuccessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->forkSuccessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->forkSuccessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->forkSuccessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->forkSuccessors_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->correspondingJoins_)._M_t._M_impl.super__Rb_tree_header;
  (this->correspondingJoins_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->correspondingJoins_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->correspondingJoins_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->correspondingJoins_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->correspondingJoins_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

ForkNode::ForkNode(const llvm::Instruction *instruction,
                   const llvm::CallInst *callInst)
        : Node(NodeType::FORK, instruction, callInst) {}